

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>::
AdapterPromiseNode<kj::TimerImpl&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&>
          (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter> *this,
          TimerImpl *params,
          Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *params_1)

{
  TimerImpl *parent;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *pAVar1;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *params_local_1;
  TimerImpl *params_local;
  AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<void>::PromiseFulfiller((PromiseFulfiller<void> *)(this + 0x18));
  *(undefined ***)this = &PTR_destroy_00c13790;
  *(undefined ***)(this + 0x18) = &PTR_reject_00c137e0;
  ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)(this + 0x20));
  this[0x1c0] = (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>)0x1;
  parent = fwd<kj::TimerImpl&>(params);
  pAVar1 = fwd<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&>(params_1);
  TimerImpl::TimerPromiseAdapter::TimerPromiseAdapter
            ((TimerPromiseAdapter *)(this + 0x1c8),(PromiseFulfiller<void> *)(this + 0x18),parent,
             (TimePoint)(pAVar1->value).value);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}